

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcole.c
# Opt level: O2

int fffi4r4(int *input,long ntodo,double scale,double zero,int nullcheck,int tnull,float nullval,
           char *nullarray,int *anynull,float *output,int *status)

{
  long lVar1;
  long lVar2;
  
  if (nullcheck == 0) {
    lVar1 = 0;
    if (0 < ntodo) {
      lVar1 = ntodo;
    }
    lVar2 = 0;
    if (scale != 1.0 || zero != 0.0) {
      for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
        output[lVar2] = (float)((double)input[lVar2] * scale + zero);
      }
    }
    else {
      for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
        output[lVar2] = (float)input[lVar2];
      }
    }
  }
  else {
    lVar1 = 0;
    if (0 < ntodo) {
      lVar1 = ntodo;
    }
    lVar2 = 0;
    if (scale != 1.0 || zero != 0.0) {
      for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
        if (input[lVar2] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar2] = nullval;
          }
          else {
            nullarray[lVar2] = '\x01';
          }
        }
        else {
          output[lVar2] = (float)((double)input[lVar2] * scale + zero);
        }
      }
    }
    else {
      for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
        if (input[lVar2] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar2] = nullval;
          }
          else {
            nullarray[lVar2] = '\x01';
          }
        }
        else {
          output[lVar2] = (float)input[lVar2];
        }
      }
    }
  }
  return *status;
}

Assistant:

int fffi4r4(INT32BIT *input,      /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            INT32BIT tnull,       /* I - value of FITS TNULLn keyword if any */
            float nullval,        /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            float *output,        /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
                output[ii] = (float) input[ii];  /* copy input to output */
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                output[ii] = (float) (input[ii] * scale + zero);
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                    output[ii] = (float) input[ii];
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    output[ii] = (float) (input[ii] * scale + zero);
                }
            }
        }
    }
    return(*status);
}